

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# palette.c
# Opt level: O3

void av1_restore_uv_color_map(AV1_COMP *cpi,MACROBLOCK *x)

{
  uint8_t uVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  MB_MODE_INFO *pMVar5;
  PALETTE_BUFFER *pPVar6;
  uint8_t *puVar7;
  byte bVar8;
  byte bVar9;
  uint uVar10;
  long lVar12;
  int16_t *piVar13;
  uint uVar14;
  long lVar15;
  ulong uVar16;
  uint8_t *puVar17;
  ushort uVar18;
  long lVar19;
  byte bVar20;
  uint8_t *puVar21;
  long lVar22;
  uint16_t *puVar23;
  uint uVar24;
  ulong uVar25;
  long lVar26;
  int16_t *piVar27;
  uint uVar28;
  uint uVar29;
  long lVar30;
  size_t __n;
  int16_t centroids [16];
  long local_d0;
  uint local_a0;
  int16_t local_58 [20];
  ulong uVar11;
  
  pMVar5 = *(x->e_mbd).mi;
  iVar3 = (x->e_mbd).mb_to_bottom_edge;
  iVar4 = (x->e_mbd).mb_to_right_edge;
  bVar2 = (byte)(x->e_mbd).plane[1].subsampling_x;
  bVar20 = (byte)(x->e_mbd).plane[1].subsampling_y;
  bVar8 = block_size_wide[pMVar5->bsize] >> (bVar2 & 0x1f);
  bVar9 = block_size_high[pMVar5->bsize] >> (bVar20 & 0x1f);
  pPVar6 = x->palette_buffer;
  piVar27 = pPVar6->kmeans_data_buf;
  puVar7 = (x->e_mbd).plane[1].color_index_map;
  bVar20 = bVar20 & 0x1f;
  uVar24 = (int)((iVar3 >> 0x1f & iVar3 >> 3) + (uint)block_size_high[pMVar5->bsize]) >> bVar20;
  uVar28 = (int)((iVar4 >> 0x1f & iVar4 >> 3) + (uint)block_size_wide[pMVar5->bsize]) >>
           (bVar2 & 0x1f);
  iVar3 = (uint)(bVar9 < 4) * 2;
  uVar14 = uVar28 + (uint)(bVar8 < 4) * 2;
  uVar10 = iVar3 + uVar24;
  uVar11 = (ulong)uVar10;
  if (uVar10 != 0 && SCARRY4(iVar3,uVar24) == (int)uVar10 < 0) {
    lVar12 = (long)x->plane[1].src.stride;
    puVar17 = x->plane[1].src.buf;
    puVar21 = x->plane[2].src.buf;
    lVar22 = (long)puVar17 * 2;
    lVar26 = (long)puVar21 * 2;
    lVar15 = (long)(int)uVar14;
    local_d0 = 0;
    uVar25 = (ulong)(uint)(0 >> bVar20);
    piVar13 = piVar27;
    do {
      if (0 < (int)uVar14) {
        uVar1 = ((cpi->common).seq_params)->use_highbitdepth;
        uVar16 = 0;
        lVar19 = local_d0;
        do {
          if (uVar1 == '\0') {
            piVar13[uVar16 * 2] = (ushort)puVar17[uVar16];
            uVar18 = (ushort)puVar21[uVar16];
            lVar30 = lVar19;
          }
          else {
            piVar13[uVar16 * 2] = *(int16_t *)(lVar22 + uVar16 * 2);
            uVar18 = *(ushort *)(lVar26 + uVar16 * 2);
            lVar30 = (uVar16 + uVar25 * lVar15) * 2;
          }
          pPVar6->kmeans_data_buf[lVar30 + 1] = uVar18;
          uVar16 = uVar16 + 1;
          lVar19 = lVar19 + 2;
        } while (uVar14 != uVar16);
      }
      uVar25 = uVar25 + 1;
      local_d0 = local_d0 + lVar15 * 2;
      piVar13 = piVar13 + lVar15 * 2;
      lVar26 = lVar26 + lVar12 * 2;
      lVar22 = lVar22 + lVar12 * 2;
      puVar17 = puVar17 + lVar12;
      puVar21 = puVar21 + lVar12;
    } while (uVar25 != uVar11);
  }
  uVar29 = (uint)bVar8 + (uint)(bVar8 < 4) * 2;
  bVar2 = (pMVar5->palette_mode_info).palette_size[1];
  puVar23 = (pMVar5->palette_mode_info).palette_colors;
  lVar22 = 1;
  piVar13 = local_58;
  bVar20 = bVar2;
  do {
    puVar23 = puVar23 + 8;
    if (bVar20 == 0) {
      bVar20 = 0;
    }
    else {
      uVar25 = 0;
      do {
        piVar13[uVar25 * 2] = puVar23[uVar25];
        uVar25 = uVar25 + 1;
        bVar20 = bVar2;
      } while (uVar25 < bVar2);
    }
    lVar22 = lVar22 + 1;
    piVar13 = piVar13 + 1;
  } while (lVar22 != 3);
  (*av1_calc_indices_dim2)(piVar27,local_58,puVar7,(int64_t *)0x0,uVar10 * uVar14,(uint)bVar2);
  if ((bVar9 != uVar24) || (bVar8 != uVar28)) {
    uVar25 = (ulong)uVar29;
    if (0 < (int)uVar10) {
      __n = (size_t)(int)uVar14;
      uVar16 = uVar11 + 1;
      puVar17 = puVar7 + (uVar11 - 1) * __n;
      puVar21 = puVar7 + (uVar11 - 1) * uVar25;
      do {
        memmove(puVar21,puVar17,__n);
        memset(puVar21 + __n,(uint)puVar21[__n - 1],(long)(int)(uVar29 - uVar14));
        uVar16 = uVar16 - 1;
        puVar17 = puVar17 + -__n;
        puVar21 = puVar21 + -uVar25;
      } while (1 < uVar16);
    }
    local_a0 = (uint)bVar9;
    if ((int)uVar24 < (int)local_a0) {
      lVar22 = (ulong)((uint)bVar9 + (uint)(bVar9 < 4) * 2) - (long)(int)uVar10;
      puVar17 = puVar7 + (long)(int)uVar10 * uVar25;
      do {
        memcpy(puVar17,puVar7 + (int)((uVar10 - 1) * uVar29),uVar25);
        puVar17 = puVar17 + uVar25;
        lVar22 = lVar22 + -1;
      } while (lVar22 != 0);
    }
  }
  return;
}

Assistant:

void av1_restore_uv_color_map(const AV1_COMP *cpi, MACROBLOCK *x) {
  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *const mbmi = xd->mi[0];
  PALETTE_MODE_INFO *const pmi = &mbmi->palette_mode_info;
  const BLOCK_SIZE bsize = mbmi->bsize;
  int src_stride = x->plane[1].src.stride;
  const uint8_t *const src_u = x->plane[1].src.buf;
  const uint8_t *const src_v = x->plane[2].src.buf;
  int16_t *const data = x->palette_buffer->kmeans_data_buf;
  int16_t centroids[2 * PALETTE_MAX_SIZE];
  uint8_t *const color_map = xd->plane[1].color_index_map;
  int r, c;
  const uint16_t *const src_u16 = CONVERT_TO_SHORTPTR(src_u);
  const uint16_t *const src_v16 = CONVERT_TO_SHORTPTR(src_v);
  int plane_block_width, plane_block_height, rows, cols;
  av1_get_block_dimensions(bsize, 1, xd, &plane_block_width,
                           &plane_block_height, &rows, &cols);

  for (r = 0; r < rows; ++r) {
    for (c = 0; c < cols; ++c) {
      if (cpi->common.seq_params->use_highbitdepth) {
        data[(r * cols + c) * 2] = src_u16[r * src_stride + c];
        data[(r * cols + c) * 2 + 1] = src_v16[r * src_stride + c];
      } else {
        data[(r * cols + c) * 2] = src_u[r * src_stride + c];
        data[(r * cols + c) * 2 + 1] = src_v[r * src_stride + c];
      }
    }
  }

  for (r = 1; r < 3; ++r) {
    for (c = 0; c < pmi->palette_size[1]; ++c) {
      centroids[c * 2 + r - 1] = pmi->palette_colors[r * PALETTE_MAX_SIZE + c];
    }
  }

  av1_calc_indices(data, centroids, color_map, rows * cols,
                   pmi->palette_size[1], 2);
  extend_palette_color_map(color_map, cols, rows, plane_block_width,
                           plane_block_height);
}